

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

AssertionResult * __thiscall
Catch::AssertionResult::getExpressionInMacro_abi_cxx11_(AssertionResult *this)

{
  ulong uVar1;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  AssertionResult *this_local;
  
  this_local = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(local_58,in_RSI);
    std::operator+(local_38,local_58);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)local_38);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x48));
  }
  return this;
}

Assistant:

std::string AssertionResult::getExpressionInMacro() const {
		if (m_info.macroName.empty())
			return m_info.capturedExpression;
		else
			return m_info.macroName + "( " + m_info.capturedExpression + " )";
	}